

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

void wp_platform_truncate(char *msg,size_t len)

{
  long local_20;
  size_t pos;
  size_t len_local;
  char *msg_local;
  
  if (msg == (char *)0x0) {
    w_abort(-1);
  }
  if (6 < len) {
    for (local_20 = len - 7; (local_20 != 0 && (msg[local_20 + -1] != ' '));
        local_20 = local_20 + -1) {
    }
    wp_platform_copy_str(msg + local_20,len - local_20,anon_var_dwarf_b3a + 5);
  }
  return;
}

Assistant:

static void
wp_platform_truncate(
    char *msg,
    size_t len
)
{
    size_t pos;

    WP_PLATFORM_ASSERT(msg != NULL);

    if (len < WP_PLATFORM_GET_ARRAY_LEN(WP_PLATFORM_CONTINUATION_CHARS))
    {
        return;
    }

    pos = len - WP_PLATFORM_GET_ARRAY_LEN(WP_PLATFORM_CONTINUATION_CHARS);
    while (pos > 0)
    {
        // If the preceeding character is a space, we assume that we found
        // the beginning of a word.
        if (msg[pos - 1] == ' ')
        {
            break;
        }

        --pos;
    }
    wp_platform_copy_str(&msg[pos], len - pos, WP_PLATFORM_CONTINUATION_CHARS);
}